

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

int __thiscall deqp::gles31::Functional::DebugTests::init(DebugTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Context *pCVar4;
  _func_int **pp_Var5;
  anon_union_8_2_9b810bd7_for_m_func aVar6;
  undefined8 uVar7;
  iterator iVar8;
  uint uVar9;
  deUint32 dVar10;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  int extraout_EAX_17;
  int extraout_EAX_18;
  int extraout_EAX_19;
  TestNode *pTVar11;
  long *plVar12;
  TestNode *pTVar13;
  TestNode *pTVar14;
  BaseCase *this_00;
  long *plVar15;
  undefined1 *puVar16;
  FilterCase *pFVar17;
  AsyncCase *pAVar18;
  uint uVar19;
  FunctionContainer *pFVar20;
  pointer pTVar21;
  long *plVar22;
  allocator_type *paVar23;
  ulong uVar24;
  TestFunctionWrapper *pTVar25;
  int iVar26;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  *this_01;
  undefined1 in_R9B;
  int iVar27;
  ulong uVar28;
  anon_union_8_2_9b810bd7_for_m_func *paVar29;
  long lVar30;
  string name;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs_2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  funcs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  externalFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
  allFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  containers;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  textureFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  bufferFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  computeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderStorageFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  advancedBlendFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  preciseFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ssboBlockFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderDirectiveFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFunctionFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicExchangeFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageAtomicFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageStoreFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  imageLoadFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  atomicCounterFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  tessellationFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  stateFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  vaFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  fragmentFuncs;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  shaderFuncs;
  Random rng;
  long *local_470;
  long local_468;
  long local_460;
  long lStack_458;
  TestNode *local_450;
  allocator_type *local_448;
  long local_440;
  long local_438;
  long lStack_430;
  TestNode *local_428;
  TestNode *local_420;
  TestNode *local_418;
  long *local_410 [2];
  long local_400 [2];
  TestFunctionWrapper *local_3f0;
  anon_union_8_2_9b810bd7_for_m_func local_3e8;
  anon_union_8_2_9b810bd7_for_m_func aStack_3e0;
  FunctionContainer local_3d8 [4];
  ios_base local_378 [264];
  ulong local_270;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_268;
  TestFunctionWrapper *local_248;
  iterator iStack_240;
  TestFunctionWrapper *local_238;
  TestFunctionWrapper *local_228;
  const_iterator cStack_220;
  long local_218;
  ulong local_210;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_208;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1f0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1d8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1c0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_1a8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_190;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_178;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_160;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_148;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_130;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_118;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_100;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_e8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_d0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_b8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_a0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_88;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_70;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  local_58;
  deRandom local_40;
  
  NegativeTestShared::getNegativeBufferApiTestFunctions();
  wrapCoreFunctions(&local_1f0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeTextureApiTestFunctions();
  wrapCoreFunctions(&local_208,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderApiTestFunctions();
  wrapCoreFunctions(&local_58,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeFragmentApiTestFunctions();
  wrapCoreFunctions(&local_70,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeVertexArrayApiTestFunctions();
  wrapCoreFunctions(&local_88,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeStateApiTestFunctions();
  wrapCoreFunctions(&local_a0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeTessellationTestFunctions();
  wrapCoreFunctions(&local_b8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeAtomicCounterTestFunctions();
  wrapCoreFunctions(&local_d0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageLoadTestFunctions();
  wrapCoreFunctions(&local_e8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageStoreTestFunctions();
  wrapCoreFunctions(&local_100,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageAtomicTestFunctions();
  wrapCoreFunctions(&local_118,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions();
  wrapCoreFunctions(&local_130,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderFunctionTestFunctions();
  wrapCoreFunctions(&local_148,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderDirectiveTestFunctions();
  wrapCoreFunctions(&local_160,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeSSBOBlockTestFunctions();
  wrapCoreFunctions(&local_178,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativePreciseTestFunctions();
  wrapCoreFunctions(&local_190,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions();
  wrapCoreFunctions(&local_1a8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeShaderStorageTestFunctions();
  wrapCoreFunctions(&local_1c0,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  NegativeTestShared::getNegativeComputeTestFunctions();
  wrapCoreFunctions(&local_1d8,
                    (vector<deqp::gles31::Functional::NegativeTestShared::FunctionContainer,_std::allocator<deqp::gles31::Functional::NegativeTestShared::FunctionContainer>_>
                     *)&local_3e8);
  if ((FunctionContainer *)local_3e8.coreFn != (FunctionContainer *)0x0) {
    operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
  }
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x60);
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_268.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  ((local_268.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    ._M_impl.super__Vector_impl_data._M_start)->function).m_type = TYPE_DEBUG;
  ((local_268.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
    ._M_impl.super__Vector_impl_data._M_start)->function).m_func.coreFn =
       anon_unknown_1::application_messages;
  (local_268.
   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
   ._M_impl.super__Vector_impl_data._M_start)->name = "application_messages";
  (local_268.
   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
   ._M_impl.super__Vector_impl_data._M_start)->desc =
       "Externally generated messages from the application";
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].function.m_type = TYPE_DEBUG;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].function.m_func.coreFn =
       anon_unknown_1::thirdparty_messages;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].name = "third_party_messages";
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[1].desc =
       "Externally generated messages from a third party";
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].function.m_type = TYPE_DEBUG;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].function.m_func.coreFn =
       anon_unknown_1::push_pop_messages;
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].name = "push_pop_stack";
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_start[2].desc = "Messages from pushing/popping debug groups";
  local_268.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_268.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  lVar30 = 0x14;
  local_450 = pTVar11;
  local_418 = (TestNode *)this;
  do {
    local_428 = (TestNode *)operator_new(0x88);
    pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    local_3f0 = *(TestFunctionWrapper **)((long)&PTR_deinit_00b44568 + lVar30 + 4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,(char *)local_3f0,(allocator<char> *)&local_228);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar20 = (FunctionContainer *)(plVar12 + 2);
    if ((FunctionContainer *)*plVar12 == pFVar20) {
      local_3d8[0].function = pFVar20->function;
      local_3d8[0].name = (char *)plVar12[3];
    }
    else {
      local_3d8[0].function = pFVar20->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar12;
    }
    aVar6 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
    *plVar12 = (long)pFVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Test ","");
    local_420 = *(TestNode **)((long)&PTR_iterate_00b44570 + lVar30 + 4);
    plVar12 = (long *)std::__cxx11::string::append((char *)local_410);
    pTVar11 = local_428;
    paVar23 = (allocator_type *)(plVar12 + 2);
    if ((allocator_type *)*plVar12 == paVar23) {
      local_438 = *(long *)paVar23;
      lStack_430 = plVar12[3];
      local_448 = (allocator_type *)&local_438;
    }
    else {
      local_438 = *(long *)paVar23;
      local_448 = (allocator_type *)*plVar12;
    }
    local_440 = plVar12[1];
    *plVar12 = (long)paVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    uVar2 = *(undefined4 *)(&UNK_00b4457c + lVar30);
    uVar3 = *(undefined4 *)((long)&init::limits[0].name + lVar30);
    tcu::TestCase::TestCase
              ((TestCase *)local_428,pCVar4->m_testCtx,(char *)aVar6.coreFn,(char *)local_448);
    pTVar11[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b446f8;
    *(undefined4 *)&pTVar11[1].m_testCtx = 0;
    *(undefined4 *)((long)&pTVar11[1].m_testCtx + 4) = uVar3;
    *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = uVar2;
    tcu::TestNode::addChild(local_450,pTVar11);
    pTVar11 = local_418;
    local_270 = CONCAT44(local_270._4_4_,uVar3);
    local_428 = (TestNode *)CONCAT44(local_428._4_4_,uVar2);
    if (local_448 != (allocator_type *)&local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar4 = (Context *)pTVar11[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,(char *)local_3f0,(allocator<char> *)&local_228);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
    pFVar20 = (FunctionContainer *)(plVar12 + 2);
    if ((FunctionContainer *)*plVar12 == pFVar20) {
      local_3d8[0].function = pFVar20->function;
      local_3d8[0].name = (char *)plVar12[3];
      local_3e8.coreFn = (CoreTestFunc)local_3d8;
    }
    else {
      local_3d8[0].function = pFVar20->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar12;
    }
    aVar6 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
    *plVar12 = (long)pFVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Test ","");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_410);
    paVar23 = (allocator_type *)(plVar12 + 2);
    if ((allocator_type *)*plVar12 == paVar23) {
      local_438 = *(long *)paVar23;
      lStack_430 = plVar12[3];
      local_448 = (allocator_type *)&local_438;
    }
    else {
      local_438 = *(long *)paVar23;
      local_448 = (allocator_type *)*plVar12;
    }
    local_440 = plVar12[1];
    *plVar12 = (long)paVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar4->m_testCtx,(char *)aVar6.coreFn,(char *)local_448);
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b446f8;
    *(undefined4 *)&pTVar13[1].m_testCtx = 3;
    *(undefined4 *)((long)&pTVar13[1].m_testCtx + 4) = (undefined4)local_270;
    *(undefined4 *)&pTVar13[1].m_name._M_dataplus._M_p = local_428._0_4_;
    tcu::TestNode::addChild(local_450,pTVar13);
    pTVar11 = local_418;
    if (local_448 != (allocator_type *)&local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar4 = (Context *)pTVar11[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,(char *)local_3f0,(allocator<char> *)&local_228);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
    pFVar20 = (FunctionContainer *)(plVar12 + 2);
    if ((FunctionContainer *)*plVar12 == pFVar20) {
      local_3d8[0].function = pFVar20->function;
      local_3d8[0].name = (char *)plVar12[3];
      local_3e8.coreFn = (CoreTestFunc)local_3d8;
    }
    else {
      local_3d8[0].function = pFVar20->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar12;
    }
    aVar6 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
    *plVar12 = (long)pFVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Test ","");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_410);
    paVar23 = (allocator_type *)(plVar12 + 2);
    if ((allocator_type *)*plVar12 == paVar23) {
      local_438 = *(long *)paVar23;
      lStack_430 = plVar12[3];
      local_448 = (allocator_type *)&local_438;
    }
    else {
      local_438 = *(long *)paVar23;
      local_448 = (allocator_type *)*plVar12;
    }
    local_440 = plVar12[1];
    *plVar12 = (long)paVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar4->m_testCtx,(char *)aVar6.coreFn,(char *)local_448);
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b446f8;
    *(undefined4 *)&pTVar13[1].m_testCtx = 4;
    *(undefined4 *)((long)&pTVar13[1].m_testCtx + 4) = (undefined4)local_270;
    *(undefined4 *)&pTVar13[1].m_name._M_dataplus._M_p = local_428._0_4_;
    tcu::TestNode::addChild(local_450,pTVar13);
    pTVar11 = local_418;
    if (local_448 != (allocator_type *)&local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    pTVar13 = (TestNode *)operator_new(0x88);
    pCVar4 = (Context *)pTVar11[1]._vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,(char *)local_3f0,(allocator<char> *)&local_228);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
    local_3e8.coreFn = (CoreTestFunc)local_3d8;
    pFVar20 = (FunctionContainer *)(plVar12 + 2);
    if ((FunctionContainer *)*plVar12 == pFVar20) {
      local_3d8[0].function = pFVar20->function;
      local_3d8[0].name = (char *)plVar12[3];
    }
    else {
      local_3d8[0].function = pFVar20->function;
      local_3e8.coreFn = (CoreTestFunc)*plVar12;
    }
    aVar6 = local_3e8;
    aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
    *plVar12 = (long)pFVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    local_410[0] = local_400;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Test ","");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_410);
    paVar23 = (allocator_type *)(plVar12 + 2);
    if ((allocator_type *)*plVar12 == paVar23) {
      local_438 = *(long *)paVar23;
      lStack_430 = plVar12[3];
      local_448 = (allocator_type *)&local_438;
    }
    else {
      local_438 = *(long *)paVar23;
      local_448 = (allocator_type *)*plVar12;
    }
    local_440 = plVar12[1];
    *plVar12 = (long)paVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar13,pCVar4->m_testCtx,(char *)aVar6.coreFn,(char *)local_448);
    pTVar13[1]._vptr_TestNode = (_func_int **)pCVar4;
    pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b446f8;
    *(undefined4 *)&pTVar13[1].m_testCtx = 5;
    *(undefined4 *)((long)&pTVar13[1].m_testCtx + 4) = (undefined4)local_270;
    *(undefined4 *)&pTVar13[1].m_name._M_dataplus._M_p = local_428._0_4_;
    tcu::TestNode::addChild(local_450,pTVar13);
    if (local_448 != (allocator_type *)&local_438) {
      operator_delete(local_448,local_438 + 1);
    }
    this = (DebugTests *)local_418;
    if (local_410[0] != local_400) {
      operator_delete(local_410[0],local_400[0] + 1);
    }
    if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
      operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
    }
    if (local_470 != &local_460) {
      operator_delete(local_470,local_460 + 1);
    }
    lVar30 = lVar30 + 0x18;
  } while (lVar30 != 0x74);
  pTVar13 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_output","");
  pTVar11 = local_450;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT");
  pTVar13[1]._vptr_TestNode = pp_Var5;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar13[1].m_testCtx = (TestContext *)0x92e000000002;
  *(undefined4 *)&pTVar13[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_output","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x92e000000000;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_output","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x92e000000003;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_output","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x92e000000004;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_output","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x92e000000005;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_output_synchronous","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x824200000002;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_output_synchronous","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x824200000000;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_output_synchronous","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x824200000003;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_output_synchronous","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x824200000004;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x88);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_output_synchronous","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_OUTPUT_SYNCHRONOUS");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44748;
  pTVar11[1].m_testCtx = (TestContext *)0x824200000005;
  *(undefined4 *)&pTVar11[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  pTVar11 = local_450;
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar13 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_logged_messages","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar13[1]._vptr_TestNode = pp_Var5;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar13[1].m_testCtx = (TestContext *)0x914500000000;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_logged_messages","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x914500000003;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_logged_messages","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x914500000004;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_logged_messages","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_LOGGED_MESSAGES");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x914500000005;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_next_logged_message_length","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x824300000000;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_next_logged_message_length","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x824300000003;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_next_logged_message_length","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x824300000004;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"debug_next_logged_message_length","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44798;
  pTVar11[1].m_testCtx = (TestContext *)0x824300000005;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  pTVar11 = local_450;
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar13 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_group_stack_depth","")
  ;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar13[1]._vptr_TestNode = pp_Var5;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b447e8;
  *(undefined4 *)&pTVar13[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_group_stack_depth","")
  ;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b447e8;
  *(undefined4 *)&pTVar11[1].m_testCtx = 3;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_group_stack_depth","")
  ;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pFVar20 = (FunctionContainer *)(plVar12 + 2);
  if ((FunctionContainer *)*plVar12 == pFVar20) {
    local_3d8[0].function = pFVar20->function;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = pFVar20->function;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)plVar12[1];
  *plVar12 = (long)pFVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b447e8;
  *(undefined4 *)&pTVar11[1].m_testCtx = 4;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar11 = (TestNode *)operator_new(0x80);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  local_470 = &local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"debug_group_stack_depth","")
  ;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_470);
  local_3e8.coreFn = (CoreTestFunc)local_3d8;
  pTVar21 = (pointer)(plVar12 + 2);
  if ((pointer)*plVar12 == pTVar21) {
    local_3d8[0].function = *(TestFunc *)pTVar21;
    local_3d8[0].name = (char *)plVar12[3];
  }
  else {
    local_3d8[0].function = *(TestFunc *)pTVar21;
    local_3e8.coreFn = (CoreTestFunc)*plVar12;
  }
  aStack_3e0 = *(anon_union_8_2_9b810bd7_for_m_func *)(plVar12 + 1);
  *plVar12 = (long)pTVar21;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,(char *)local_3e8.coreFn,
             "Test DEBUG_GROUP_STACK_DEPTH");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b447e8;
  *(undefined4 *)&pTVar11[1].m_testCtx = 5;
  tcu::TestNode::addChild(local_450,pTVar11);
  if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
    operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
  }
  pTVar11 = local_450;
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  pTVar13 = (TestNode *)operator_new(0x78);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,(TestContext *)*pp_Var5,"debug_callback_function_getpointer",
             "Test DEBUG_CALLBACK_FUNCTION");
  pTVar13[1]._vptr_TestNode = pp_Var5;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44838;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar13 = (TestNode *)operator_new(0x78);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar13,(TestContext *)*pp_Var5,"debug_callback_user_param_getpointer",
             "Test DEBUG_CALLBACK_USER_PARAM");
  pTVar13[1]._vptr_TestNode = pp_Var5;
  pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44888;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,((TestNode *)this)->m_testCtx,"negative_coverage",
             "API error coverage with various reporting methods");
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,((TestNode *)this)->m_testCtx,"callbacks",
             "Reporting of standard API errors via callback");
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"buffer",
                              "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"texture"
                              ,"Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"shader",
                              "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "fragment","Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "vertex_array","Negative Vertex Array API Cases",&local_88)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"state",
                              "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "atomic_counter","Negative Atomic Counter API Cases",&local_d0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_load","Negative Shader Image Load API Cases",&local_e8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &local_100)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",&local_130)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_function","Negative Shader Function Cases",&local_148)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_directive","Negative Shader Directive Cases",&local_160)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "ssbo_block","Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"precise"
                              ,"Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "advanced_blend","Negative Advanced Blend Equation Cases",&local_1a8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_storage","Negative Shader Storage Cases",&local_1c0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "tessellation","Negative Tessellation Cases",&local_b8)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"compute"
                              ,"Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,((TestNode *)this)->m_testCtx,"log",
             "Reporting of standard API errors via log");
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"buffer",
                              "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"texture"
                              ,"Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"shader",
                              "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "fragment","Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "vertex_array","Negative Vertex Array API Cases",&local_88)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"state",
                              "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "atomic_counter","Negative Atomic Counter API Cases",&local_d0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_load","Negative Shader Image Load API Cases",&local_e8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &local_100)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",&local_130)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_function","Negative Shader Function Cases",&local_148)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_directive","Negative Shader Directive Cases",&local_160)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "ssbo_block","Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"precise"
                              ,"Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "advanced_blend","Negative Advanced Blend Equation Cases",&local_1a8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_storage","Negative Shader Storage Cases",&local_1c0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "tessellation","Negative Tessellation Cases",&local_b8)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = &createChildCases(CASETYPE_LOG,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"compute"
                              ,"Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,((TestNode *)this)->m_testCtx,"get_error",
             "Reporting of standard API errors via glGetError");
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"buffer",
                              "Negative Buffer API Cases",&local_1f0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"texture"
                              ,"Negative Texture API Cases",&local_208)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"shader",
                              "Negative Shader API Cases",&local_58)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "fragment","Negative Fragment API Cases",&local_70)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "vertex_array","Negative Vertex Array API Cases",&local_88)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"state",
                              "Negative GL State API Cases",&local_a0)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "atomic_counter","Negative Atomic Counter API Cases",&local_d0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_load","Negative Shader Image Load API Cases",&local_e8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_store","Negative Shader Image Store API Cases",
                              &local_100)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_atomic","Negative Shader Image Atomic API Cases",
                              &local_118)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_image_exchange",
                              "Negative Shader Image Atomic Exchange API Cases",&local_130)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_function","Negative Shader Function Cases",&local_148)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_directive","Negative Shader Directive Cases",&local_160)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "ssbo_block","Negative SSBO Block Cases",&local_178)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"precise"
                              ,"Negative Precise Cases",&local_190)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "advanced_blend","Negative Advanced Blend Equation Cases",&local_1a8)
             ->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "shader_storage","Negative Shader Storage Cases",&local_1c0)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "tessellation","Negative Tessellation Cases",&local_b8)->
             super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_GETERROR,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"compute"
                              ,"Negative Compute Cases",&local_1d8)->super_TestNode;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  pTVar11 = &createChildCases(CASETYPE_CALLBACK,
                              (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
                              "externally_generated","Externally Generated Messages",&local_268)->
             super_TestNode;
  this_00 = (BaseCase *)operator_new(0xf8);
  anon_unknown_1::BaseCase::BaseCase
            (this_00,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "push_pop_consistency","Push/pop message generation with full message output checking")
  ;
  (this_00->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GroupCase_00b44a78;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)0x0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
       (pointer)&this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.
                 field_2;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
       0;
  this_00[1].super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
  _M_local_buf[0] = '\0';
  tcu::TestNode::addChild(pTVar11,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  local_228 = (TestFunctionWrapper *)0x0;
  cStack_220._M_current = (FunctionContainer *)0x0;
  local_218 = 0;
  local_238 = (TestFunctionWrapper *)0x0;
  local_248 = (TestFunctionWrapper *)0x0;
  iStack_240._M_current = (TestFunctionWrapper *)0x0;
  uVar9 = tcu::CommandLine::getBaseSeed
                    (*(CommandLine **)(*((TestNode *)((long)this + 0x70))->_vptr_TestNode + 0x18));
  deRandom_init(&local_40,uVar9 ^ 0x53941903);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_228,cStack_220,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_1f0.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_1f0.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_228,cStack_220,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_208.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_208.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
  ::
  insert<__gnu_cxx::__normal_iterator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_const*,std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>>,void>
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>>
              *)&local_228,cStack_220,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_268.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer_*,_std::vector<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>_>
              )local_268.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  if ((long)cStack_220._M_current - (long)local_228 != 0) {
    lVar30 = (long)cStack_220._M_current - (long)local_228 >> 5;
    lVar30 = lVar30 + (ulong)(lVar30 == 0);
    pTVar25 = local_228;
    do {
      if (iStack_240._M_current == local_238) {
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
        ::
        _M_realloc_insert<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper_const&>
                  ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                    *)&local_248,iStack_240,pTVar25);
      }
      else {
        uVar2 = *(undefined4 *)&pTVar25->field_0x4;
        aVar6 = pTVar25->m_func;
        (iStack_240._M_current)->m_type = pTVar25->m_type;
        *(undefined4 *)&(iStack_240._M_current)->field_0x4 = uVar2;
        (iStack_240._M_current)->m_func = aVar6;
        iStack_240._M_current = iStack_240._M_current + 1;
      }
      pTVar25 = pTVar25 + 2;
      lVar30 = lVar30 + -1;
    } while (lVar30 != 0);
  }
  pTVar25 = local_248;
  local_420 = (TestNode *)((ulong)((long)iStack_240._M_current - (long)local_248) >> 4);
  uVar9 = (int)local_420 - 1;
  if (0 < (int)uVar9) {
    uVar28 = (ulong)uVar9 + 1;
    paVar29 = (anon_union_8_2_9b810bd7_for_m_func *)(local_248 + uVar9);
    do {
      dVar10 = deRandom_getUint32(&local_40);
      iVar26 = (int)((ulong)dVar10 % (uVar28 & 0xffffffff));
      local_3e8 = *paVar29;
      aStack_3e0 = paVar29[1];
      aVar6 = ((anon_union_8_2_9b810bd7_for_m_func *)(pTVar25 + iVar26))[1];
      *paVar29 = *(anon_union_8_2_9b810bd7_for_m_func *)(pTVar25 + iVar26);
      paVar29[1] = aVar6;
      *(anon_union_8_2_9b810bd7_for_m_func *)(pTVar25 + iVar26) = local_3e8;
      ((anon_union_8_2_9b810bd7_for_m_func *)(pTVar25 + iVar26))[1] = aStack_3e0;
      uVar28 = uVar28 - 1;
      paVar29 = paVar29 + -2;
    } while (1 < (long)uVar28);
  }
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,((TestNode *)this)->m_testCtx,"error_filters",
             "Filtering of reported errors");
  local_428 = pTVar11;
  tcu::TestNode::addChild((TestNode *)this,pTVar11);
  uVar9 = (int)local_420 + 3;
  if (3 < (int)uVar9) {
    uVar9 = uVar9 >> 2;
    uVar19 = 0x20;
    if (uVar9 < 0x20) {
      uVar19 = uVar9;
    }
    local_210 = 1;
    if (1 < uVar19) {
      local_210 = (ulong)uVar19;
    }
    local_270 = (ulong)(int)local_420;
    iVar26 = 4;
    pTVar11 = (TestNode *)0x0;
    uVar28 = 0;
    do {
      uVar24 = (long)iVar26;
      if ((long)local_270 <= (long)iVar26) {
        uVar24 = local_270;
      }
      iVar27 = (int)uVar28 * 4 + 4;
      if ((int)local_420 <= iVar27) {
        iVar27 = (int)local_420;
      }
      local_450 = pTVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)uVar28);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_448,0,(char *)0x0,0x95e083);
      plVar12 = &local_460;
      plVar22 = plVar15 + 2;
      if ((long *)*plVar15 == plVar22) {
        local_460 = *plVar22;
        lStack_458 = plVar15[3];
        local_470 = plVar12;
      }
      else {
        local_460 = *plVar22;
        local_470 = (long *)*plVar15;
      }
      local_3f0 = (TestFunctionWrapper *)CONCAT44(local_3f0._4_4_,iVar26);
      local_468 = plVar15[1];
      *plVar15 = (long)plVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if (local_448 != (allocator_type *)&local_438) {
        plVar12 = (long *)(local_438 + 1);
        operator_delete(local_448,(ulong)plVar12);
      }
      local_3e8.coreFn = (CoreTestFunc)0x0;
      aStack_3e0 = (anon_union_8_2_9b810bd7_for_m_func)0x0;
      local_3d8[0].function = (TestFunc)0x0;
      lVar30 = (long)iVar27 * 0x10 + uVar28 * -0x40;
      this_01 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                 *)(lVar30 >> 4);
      if ((ulong)this_01 >> 0x3b != 0) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      local_3e8.coreFn =
           (CoreTestFunc)
           std::
           _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
           ::_M_allocate(this_01,(size_t)plVar12);
      pTVar11 = local_450;
      local_3d8[0].function = local_3e8.coreFn + lVar30;
      iVar26 = (int)local_3f0;
      aStack_3e0.coreFn = local_3e8.coreFn;
      if ((long)iVar27 * 0x10 != uVar28 * 0x40) {
        puVar16 = (undefined1 *)0x0;
        do {
          puVar1 = (undefined8 *)((long)&pTVar25->m_type + (long)puVar16);
          uVar7 = puVar1[1];
          *(undefined8 *)(local_3e8.coreFn + (long)puVar16) = *puVar1;
          *(undefined8 *)(local_3e8.coreFn + (long)puVar16 + 8) = uVar7;
          puVar16 = puVar16 + 0x10;
        } while (&local_450->_vptr_TestNode + uVar24 * 2 != (_func_int ***)puVar16);
        aStack_3e0.coreFn = local_3e8.coreFn + (long)puVar16;
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
      ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)&local_3e8,(const_iterator)aStack_3e0,
               (value_type *)
               ((long)&(local_268.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                        ._M_impl.super__Vector_impl_data._M_start)->function +
               (uVar28 % (ulong)((long)local_268.
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_268.
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5)) * 4 * 8));
      pFVar17 = (FilterCase *)operator_new(0xe8);
      anon_unknown_1::FilterCase::FilterCase
                (pFVar17,(Context *)local_418[1]._vptr_TestNode,(char *)local_470,
                 "DebugMessageControl usage",
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)&local_3e8);
      tcu::TestNode::addChild(local_428,(TestNode *)pFVar17);
      if ((pointer)local_3e8.coreFn != (pointer)0x0) {
        operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
      }
      if (local_470 != &local_460) {
        operator_delete(local_470,local_460 + 1);
      }
      uVar28 = uVar28 + 1;
      pTVar11 = (TestNode *)&pTVar11[-1].m_description;
      iVar26 = iVar26 + 4;
      pTVar25 = pTVar25 + 4;
    } while (uVar28 != local_210);
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  pTVar11 = local_418;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,local_418->m_testCtx,"error_groups",
             "Filtering of reported errors with use of Error Groups");
  iVar8._M_current = iStack_240._M_current;
  pTVar25 = local_248;
  local_420 = pTVar13;
  tcu::TestNode::addChild(pTVar11,pTVar13);
  local_3f0 = pTVar25;
  local_450 = (TestNode *)((ulong)((long)iVar8._M_current - (long)pTVar25) >> 4);
  uVar9 = (int)local_450 + 3;
  if (3 < (int)uVar9) {
    uVar9 = uVar9 >> 2;
    uVar19 = 0x10;
    if (uVar9 < 0x10) {
      uVar19 = uVar9;
    }
    local_428 = (TestNode *)
                local_268.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_270 = (long)local_268.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_268.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
    local_210 = 1;
    if (1 < uVar19) {
      local_210 = (ulong)uVar19;
    }
    iVar26 = 4;
    uVar28 = 0;
    do {
      iVar27 = (int)local_450;
      if (iVar26 < (int)local_450) {
        iVar27 = iVar26;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)uVar28);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_410,0,(char *)0x0,0x95e083);
      local_448 = (allocator_type *)&local_438;
      paVar23 = (allocator_type *)(plVar12 + 2);
      if ((allocator_type *)*plVar12 == paVar23) {
        local_438 = *(long *)paVar23;
        lStack_430 = plVar12[3];
      }
      else {
        local_438 = *(long *)paVar23;
        local_448 = (allocator_type *)*plVar12;
      }
      local_440 = plVar12[1];
      *plVar12 = (long)paVar23;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,(char *)local_448,(allocator<char> *)&local_3e8);
      if (local_448 != (allocator_type *)&local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      if (local_410[0] != local_400) {
        operator_delete(local_410[0],local_400[0] + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
      ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
                ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                  *)&local_3e8,pTVar25,local_3f0 + iVar27,paVar23);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
      ::insert((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                *)&local_3e8,(const_iterator)aStack_3e0,
               (value_type *)(&local_428->_vptr_TestNode + (uVar28 % local_270) * 4));
      pFVar17 = (FilterCase *)operator_new(0xe8);
      anon_unknown_1::FilterCase::FilterCase
                (pFVar17,(Context *)local_418[1]._vptr_TestNode,(char *)local_470,
                 "Debug Group usage",
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                  *)&local_3e8);
      (pFVar17->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode = (_func_int **)&PTR__FilterCase_00b44b48;
      tcu::TestNode::addChild(local_420,(TestNode *)pFVar17);
      if ((pointer)local_3e8.coreFn != (pointer)0x0) {
        operator_delete(local_3e8.coreFn,(long)local_3d8[0].function - (long)local_3e8);
      }
      if (local_470 != &local_460) {
        operator_delete(local_470,local_460 + 1);
      }
      uVar28 = uVar28 + 1;
      iVar26 = iVar26 + 4;
      pTVar25 = pTVar25 + 4;
    } while (local_210 != uVar28);
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  pTVar11 = local_418;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,local_418->m_testCtx,"async","Asynchronous message generation"
            );
  tcu::TestNode::addChild(pTVar11,pTVar13);
  uVar9 = (int)local_450 + 1;
  if (1 < (int)uVar9) {
    uVar9 = uVar9 >> 1;
    uVar19 = 0x10;
    if (uVar9 < 0x10) {
      uVar19 = uVar9;
    }
    if (uVar19 < 2) {
      uVar19 = 1;
    }
    local_428 = (TestNode *)(ulong)uVar19;
    local_450 = (TestNode *)((ulong)((long)iStack_240._M_current - (long)local_248) >> 4);
    iVar26 = 2;
    pTVar14 = (TestNode *)0x0;
    local_3f0 = local_248;
    pTVar25 = local_248;
    local_420 = pTVar13;
    do {
      iVar27 = (int)local_450;
      if (iVar26 < (int)local_450) {
        iVar27 = iVar26;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3e8);
      std::ostream::operator<<(&local_3e8,(int)pTVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3e8);
      std::ios_base::~ios_base(local_378);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_410,0,(char *)0x0,0x95e083);
      local_448 = (allocator_type *)&local_438;
      paVar23 = (allocator_type *)(plVar12 + 2);
      if ((allocator_type *)*plVar12 == paVar23) {
        local_438 = *(long *)paVar23;
        lStack_430 = plVar12[3];
      }
      else {
        local_438 = *(long *)paVar23;
        local_448 = (allocator_type *)*plVar12;
      }
      local_440 = plVar12[1];
      *plVar12 = (long)paVar23;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,(char *)local_448,(allocator<char> *)&local_3e8);
      if (local_448 != (allocator_type *)&local_438) {
        operator_delete(local_448,local_438 + 1);
      }
      if (local_410[0] != local_400) {
        operator_delete(local_410[0],local_400[0] + 1);
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
      ::vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper*,void>
                ((vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>>
                  *)&local_448,pTVar25,local_3f0 + iVar27,paVar23);
      if (((ulong)pTVar14 & 1) == 0) {
        pAVar18 = (AsyncCase *)operator_new(0x120);
        pCVar4 = (Context *)pTVar11[1]._vptr_TestNode;
        local_3e8.coreFn = (CoreTestFunc)local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_470,(long)local_470 + local_468);
        std::__cxx11::string::append((char *)&local_3e8);
        anon_unknown_1::AsyncCase::AsyncCase
                  (pAVar18,pCVar4,(char *)local_3e8.coreFn,(char *)&local_448,
                   (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    *)0x0,(bool)in_R9B);
        tcu::TestNode::addChild(local_420,(TestNode *)pAVar18);
      }
      else {
        pAVar18 = (AsyncCase *)operator_new(0x120);
        pCVar4 = (Context *)pTVar11[1]._vptr_TestNode;
        local_3e8.coreFn = (CoreTestFunc)local_3d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_470,(long)local_470 + local_468);
        std::__cxx11::string::append((char *)&local_3e8);
        anon_unknown_1::AsyncCase::AsyncCase
                  (pAVar18,pCVar4,(char *)local_3e8.coreFn,(char *)&local_448,
                   (vector<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TestFunctionWrapper>_>
                    *)&DAT_00000001,(bool)in_R9B);
        tcu::TestNode::addChild(local_420,(TestNode *)pAVar18);
      }
      if ((FunctionContainer *)local_3e8.coreFn != local_3d8) {
        operator_delete(local_3e8.coreFn,(ulong)(local_3d8[0].function + 1));
      }
      pTVar11 = local_418;
      if (local_448 != (allocator_type *)0x0) {
        operator_delete(local_448,local_438 - (long)local_448);
      }
      if (local_470 != &local_460) {
        operator_delete(local_470,local_460 + 1);
      }
      pTVar14 = (TestNode *)((long)&pTVar14->_vptr_TestNode + 1);
      iVar26 = iVar26 + 2;
      pTVar25 = pTVar25 + 2;
    } while (local_428 != pTVar14);
  }
  if (local_248 != (TestFunctionWrapper *)0x0) {
    operator_delete(local_248,(long)local_238 - (long)local_248);
  }
  if (local_228 != (TestFunctionWrapper *)0x0) {
    operator_delete(local_228,local_218 - (long)local_228);
  }
  pTVar13 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar13,pTVar11->m_testCtx,"object_labels","Labeling objects");
  tcu::TestNode::addChild(pTVar11,pTVar13);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"initial","Debug label initial value");
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44c18;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"clearing","Debug label clearing");
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44c68;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"specify_with_length",
             "Debug label specified with length");
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44cf0;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"buffer_limited_query",
             "Debug label query to too short buffer");
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44d40;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"max_label_length","Max sized debug label")
  ;
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44d90;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  pTVar14 = (TestNode *)operator_new(0x78);
  pp_Var5 = pTVar11[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar14,(TestContext *)*pp_Var5,"query_length_only",
             "Query debug label length");
  pTVar14[1]._vptr_TestNode = pp_Var5;
  pTVar14->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44de0;
  tcu::TestNode::addChild(pTVar13,pTVar14);
  lVar30 = 0x10;
  do {
    pTVar11 = (TestNode *)operator_new(0x80);
    pp_Var5 = local_418[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::limits[3].targetName + lVar30);
    tcu::TestCase::TestCase
              ((TestCase *)pTVar11,(TestContext *)*pp_Var5,
               *(char **)((long)&init::limits[3].target + lVar30),
               *(char **)((long)&DAT_00b445e0 + lVar30));
    pTVar11[1]._vptr_TestNode = pp_Var5;
    pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44e30;
    *(undefined4 *)&pTVar11[1].m_testCtx = uVar2;
    tcu::TestNode::addChild(pTVar13,pTVar11);
    lVar30 = lVar30 + 0x18;
  } while (lVar30 != 0x100);
  pTVar11 = (TestNode *)operator_new(0x78);
  pp_Var5 = local_418[1]._vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,(TestContext *)*pp_Var5,"sync","Debug label on a sync object");
  pTVar11[1]._vptr_TestNode = pp_Var5;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b44e80;
  tcu::TestNode::addChild(pTVar13,pTVar11);
  iVar26 = extraout_EAX;
  if ((TestNode *)
      local_268.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (TestNode *)0x0) {
    operator_delete(local_268.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_00;
  }
  if (local_1d8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_01;
  }
  if (local_1c0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_02;
  }
  if (local_1a8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_03;
  }
  if (local_190.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_190.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_04;
  }
  if (local_178.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_05;
  }
  if (local_160.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_06;
  }
  if (local_148.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_07;
  }
  if (local_130.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_08;
  }
  if (local_118.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_09;
  }
  if (local_100.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_10;
  }
  if (local_e8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_11;
  }
  if (local_d0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_12;
  }
  if (local_b8.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_13;
  }
  if (local_a0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_14;
  }
  if (local_88.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_15;
  }
  if (local_70.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_16;
  }
  if (local_58.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_17;
  }
  if (local_208.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (FunctionContainer *)0x0) {
    operator_delete(local_208.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_18;
  }
  if (local_1f0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
      ._M_impl.super__Vector_impl_data._M_start != (FunctionContainer *)0x0) {
    operator_delete(local_1f0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FunctionContainer>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar26 = extraout_EAX_19;
  }
  return iVar26;
}

Assistant:

void DebugTests::init (void)
{
	const vector<FunctionContainer> bufferFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeBufferApiTestFunctions());
	const vector<FunctionContainer> textureFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeTextureApiTestFunctions());
	const vector<FunctionContainer> shaderFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderApiTestFunctions());
	const vector<FunctionContainer> fragmentFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeFragmentApiTestFunctions());
	const vector<FunctionContainer> vaFuncs					 = wrapCoreFunctions(NegativeTestShared::getNegativeVertexArrayApiTestFunctions());
	const vector<FunctionContainer> stateFuncs				 = wrapCoreFunctions(NegativeTestShared::getNegativeStateApiTestFunctions());
	const vector<FunctionContainer> tessellationFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeTessellationTestFunctions());
	const vector<FunctionContainer> atomicCounterFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAtomicCounterTestFunctions());
	const vector<FunctionContainer> imageLoadFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageLoadTestFunctions());
	const vector<FunctionContainer> imageStoreFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageStoreTestFunctions());
	const vector<FunctionContainer> imageAtomicFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicTestFunctions());
	const vector<FunctionContainer> imageAtomicExchangeFuncs = wrapCoreFunctions(NegativeTestShared::getNegativeShaderImageAtomicExchangeTestFunctions());
	const vector<FunctionContainer> shaderFunctionFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderFunctionTestFunctions());
	const vector<FunctionContainer> shaderDirectiveFuncs	 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderDirectiveTestFunctions());
	const vector<FunctionContainer> ssboBlockFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeSSBOBlockTestFunctions());
	const vector<FunctionContainer> preciseFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativePreciseTestFunctions());
	const vector<FunctionContainer> advancedBlendFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeAdvancedBlendEquationTestFunctions());
	const vector<FunctionContainer> shaderStorageFuncs		 = wrapCoreFunctions(NegativeTestShared::getNegativeShaderStorageTestFunctions());
	const vector<FunctionContainer> computeFuncs			 = wrapCoreFunctions(NegativeTestShared::getNegativeComputeTestFunctions());
	const vector<FunctionContainer> externalFuncs			 = getUserMessageFuncs();

	{
		using namespace gls::StateQueryUtil;

		tcu::TestCaseGroup* const queries = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query");

		static const struct
		{
			const char*	name;
			const char*	targetName;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{ "max_debug_message_length",		"MAX_DEBUG_MESSAGE_LENGTH",		GL_MAX_DEBUG_MESSAGE_LENGTH,	1	},
			{ "max_debug_logged_messages",		"MAX_DEBUG_LOGGED_MESSAGES",	GL_MAX_DEBUG_LOGGED_MESSAGES,	1	},
			{ "max_debug_group_stack_depth",	"MAX_DEBUG_GROUP_STACK_DEPTH",	GL_MAX_DEBUG_GROUP_STACK_DEPTH,	64	},
			{ "max_label_length",				"MAX_LABEL_LENGTH",				GL_MAX_LABEL_LENGTH,			256	},
		};

		addChild(queries);

		#define FOR_ALL_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_getboolean"; \
					const QueryType		queryType = QUERY_BOOLEAN; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger"; \
					const QueryType		queryType = QUERY_INTEGER; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getinteger64"; \
					const QueryType		queryType = QUERY_INTEGER64; \
					X; \
				} \
				{ \
					const char* const	postfix = "_getfloat"; \
					const QueryType		queryType = QUERY_FLOAT; \
					X; \
				} \
			} \
			while (deGetFalse())
		#define FOR_ALL_ENABLE_TYPES(X) \
			do \
			{ \
				{ \
					const char* const	postfix = "_isenabled"; \
					const QueryType		queryType = QUERY_ISENABLED; \
					X; \
				} \
				FOR_ALL_TYPES(X); \
			} \
			while (deGetFalse())

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
		{
			FOR_ALL_TYPES(queries->addChild(new LimitQueryCase(m_context,
															   (std::string(limits[ndx].name) + postfix).c_str(),
															   (std::string("Test ") + limits[ndx].targetName).c_str(),
															   limits[ndx].target, limits[ndx].limit, queryType)));
		}

		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output") + postfix).c_str(),						"Test DEBUG_OUTPUT",						GL_DEBUG_OUTPUT,				IsEnabledCase::INITIAL_CTX_IS_DEBUG,	queryType)));
		FOR_ALL_ENABLE_TYPES(queries->addChild(new IsEnabledCase	(m_context, (std::string("debug_output_synchronous") + postfix).c_str(),			"Test DEBUG_OUTPUT_SYNCHRONOUS",			GL_DEBUG_OUTPUT_SYNCHRONOUS,	IsEnabledCase::INITIAL_FALSE,			queryType)));

		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_logged_messages") + postfix).c_str(),				"Test DEBUG_LOGGED_MESSAGES",				GL_DEBUG_LOGGED_MESSAGES,				queryType)));
		FOR_ALL_TYPES(queries->addChild(new PositiveIntegerCase		(m_context, (std::string("debug_next_logged_message_length") + postfix).c_str(),	"Test DEBUG_NEXT_LOGGED_MESSAGE_LENGTH",	GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH,	queryType)));
		FOR_ALL_TYPES(queries->addChild(new GroupStackDepthQueryCase(m_context, (std::string("debug_group_stack_depth") + postfix).c_str(),				"Test DEBUG_GROUP_STACK_DEPTH",				queryType)));

		queries->addChild(new DebugCallbackFunctionCase	(m_context, "debug_callback_function_getpointer",	"Test DEBUG_CALLBACK_FUNCTION"));
		queries->addChild(new DebugCallbackUserParamCase(m_context, "debug_callback_user_param_getpointer", "Test DEBUG_CALLBACK_USER_PARAM"));

		#undef FOR_ALL_TYPES
		#undef FOR_ALL_ENABLE_TYPES
	}

	{
		tcu::TestCaseGroup* const	negative	= new tcu::TestCaseGroup(m_testCtx, "negative_coverage", "API error coverage with various reporting methods");

		addChild(negative);
		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "callbacks", "Reporting of standard API errors via callback");

			negative->addChild(host);
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_CALLBACK, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "log", "Reporting of standard API errors via log");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_LOG, m_context, "buffer",					"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader",					"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "fragment",				"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "vertex_array",			"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "state",					"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "atomic_counter",			"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_load",		"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_store",		"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_image_exchange",	"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_directive",		"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "ssbo_block",				"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "advanced_blend",			"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "shader_storage",			"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "tessellation",			"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_LOG, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}

		{
			tcu::TestCaseGroup* const	host	= new tcu::TestCaseGroup(m_testCtx, "get_error", "Reporting of standard API errors via glGetError");

			negative->addChild(host);

			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "buffer",						"Negative Buffer API Cases",						bufferFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "texture",					"Negative Texture API Cases",						textureFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader",						"Negative Shader API Cases",						shaderFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "fragment",					"Negative Fragment API Cases",						fragmentFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "vertex_array",				"Negative Vertex Array API Cases",					vaFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "state",						"Negative GL State API Cases",						stateFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "atomic_counter",				"Negative Atomic Counter API Cases",				atomicCounterFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_load",			"Negative Shader Image Load API Cases",				imageLoadFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_store",			"Negative Shader Image Store API Cases",			imageStoreFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_atomic",		"Negative Shader Image Atomic API Cases",			imageAtomicFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_image_exchange",		"Negative Shader Image Atomic Exchange API Cases",	imageAtomicExchangeFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_function",			"Negative Shader Function Cases",					shaderFunctionFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_directive",			"Negative Shader Directive Cases",					shaderDirectiveFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "ssbo_block",					"Negative SSBO Block Cases",						ssboBlockFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "precise",					"Negative Precise Cases",							preciseFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "advanced_blend",				"Negative Advanced Blend Equation Cases",			advancedBlendFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "shader_storage",				"Negative Shader Storage Cases",					shaderStorageFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "tessellation",				"Negative Tessellation Cases",						tessellationFuncs));
			host->addChild(createChildCases(CASETYPE_GETERROR, m_context, "compute",					"Negative Compute Cases",							computeFuncs));
		}
	}

	{
		tcu::TestCaseGroup* const host = createChildCases(CASETYPE_CALLBACK, m_context, "externally_generated", "Externally Generated Messages", externalFuncs);

		host->addChild(new GroupCase(m_context, "push_pop_consistency", "Push/pop message generation with full message output checking"));

		addChild(host);
	}

	{
		vector<FunctionContainer>	containers;
		vector<TestFunctionWrapper>	allFuncs;

		de::Random					rng			(0x53941903 ^ m_context.getTestContext().getCommandLine().getBaseSeed());

		containers.insert(containers.end(), bufferFuncs.begin(), bufferFuncs.end());
		containers.insert(containers.end(), textureFuncs.begin(), textureFuncs.end());
		containers.insert(containers.end(), externalFuncs.begin(), externalFuncs.end());

		for (size_t ndx = 0; ndx < containers.size(); ndx++)
			allFuncs.push_back(containers[ndx].function);

		rng.shuffle(allFuncs.begin(), allFuncs.end());

		{
			tcu::TestCaseGroup* const	filtering				= new tcu::TestCaseGroup(m_testCtx, "error_filters", "Filtering of reported errors");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 32;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(filtering);

			for (int caseNdx = 0; caseNdx < de::min(caseCount, maxFilteringCaseCount); caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= "case_" + de::toString(caseNdx);
				vector<TestFunctionWrapper>	funcs		(allFuncs.begin()+start, allFuncs.begin()+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				filtering->addChild(new FilterCase(m_context, name.c_str(), "DebugMessageControl usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	groups					= new tcu::TestCaseGroup(m_testCtx, "error_groups", "Filtering of reported errors with use of Error Groups");
			const int					errorFuncsPerCase		= 4;
			const int					maxFilteringCaseCount	= 16;
			const int					caseCount				= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(groups);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxFilteringCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				// These produce lots of different message types, thus always include at least one when testing filtering
				funcs.insert(funcs.end(), externalFuncs[caseNdx%externalFuncs.size()].function);

				groups->addChild(new GroupFilterCase(m_context, name.c_str(), "Debug Group usage", funcs));
			}
		}

		{
			tcu::TestCaseGroup* const	async				= new tcu::TestCaseGroup(m_testCtx, "async", "Asynchronous message generation");
			const int					errorFuncsPerCase	= 2;
			const int					maxAsyncCaseCount	= 16;
			const int					caseCount			= (int(allFuncs.size()) + errorFuncsPerCase-1) / errorFuncsPerCase;

			addChild(async);

			for (int caseNdx = 0; caseNdx < caseCount && caseNdx < maxAsyncCaseCount; caseNdx++)
			{
				const int					start		= caseNdx*errorFuncsPerCase;
				const int					end			= de::min((caseNdx+1)*errorFuncsPerCase, int(allFuncs.size()));
				const string				name		= ("case_" + de::toString(caseNdx)).c_str();
				vector<TestFunctionWrapper>	funcs		(&allFuncs[0]+start, &allFuncs[0]+end);

				if (caseNdx&0x1)
					async->addChild(new AsyncCase(m_context, (name+"_callback").c_str(), "Async message generation", funcs, true));
				else
					async->addChild(new AsyncCase(m_context, (name+"_log").c_str(), "Async message generation", funcs, false));
			}
		}
	}

	{
		tcu::TestCaseGroup* const labels = new tcu::TestCaseGroup(m_testCtx, "object_labels", "Labeling objects");

		const struct
		{
			GLenum		identifier;
			const char*	name;
			const char* desc;
		} cases[] =
		{
			{ GL_BUFFER,				"buffer",				"Debug label on a buffer object"				},
			{ GL_SHADER,				"shader",				"Debug label on a shader object"				},
			{ GL_PROGRAM,				"program",				"Debug label on a program object"				},
			{ GL_QUERY,					"query",				"Debug label on a query object"					},
			{ GL_PROGRAM_PIPELINE,		"program_pipeline",		"Debug label on a program pipeline object"		},
			{ GL_TRANSFORM_FEEDBACK,	"transform_feedback",	"Debug label on a transform feedback object"	},
			{ GL_SAMPLER,				"sampler",				"Debug label on a sampler object"				},
			{ GL_TEXTURE,				"texture",				"Debug label on a texture object"				},
			{ GL_RENDERBUFFER,			"renderbuffer",			"Debug label on a renderbuffer object"			},
			{ GL_FRAMEBUFFER,			"framebuffer",			"Debug label on a framebuffer object"			},
		};

		addChild(labels);

		labels->addChild(new InitialLabelCase		(m_context, "initial",				"Debug label initial value"));
		labels->addChild(new ClearLabelCase			(m_context, "clearing",				"Debug label clearing"));
		labels->addChild(new SpecifyWithLengthCase	(m_context, "specify_with_length",	"Debug label specified with length"));
		labels->addChild(new BufferLimitedLabelCase	(m_context, "buffer_limited_query",	"Debug label query to too short buffer"));
		labels->addChild(new LabelMaxSizeCase		(m_context, "max_label_length",		"Max sized debug label"));
		labels->addChild(new LabelLengthCase		(m_context, "query_length_only",	"Query debug label length"));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ndx++)
			labels->addChild(new LabelCase(m_context, cases[ndx].name, cases[ndx].desc, cases[ndx].identifier));
		labels->addChild(new SyncLabelCase(m_context, "sync", "Debug label on a sync object"));
	}
}